

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

void embree::avx::FlatLinearCurveMiIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  float fVar22;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  float fVar33;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar41;
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar43;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar47;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar69;
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar70 [32];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar81 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar82 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  float in_register_0000151c;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  LineIntersectorHitM<8> hit;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  RTCFilterFunctionNArguments local_370;
  undefined1 local_340 [32];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar71 [64];
  undefined1 auVar74 [64];
  
  pSVar9 = context->scene;
  uVar18 = line->sharedGeomID;
  uVar17 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[uVar18].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar19 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[4];
  auVar23._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar3 * (long)p_Var12);
  auVar23._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar17 * (long)p_Var12);
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[5];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar19 * (long)p_Var12);
  uVar7 = (line->v0).field_0.i[6];
  auVar48._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar48._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[7];
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar3 + 1) * (long)p_Var12);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar17 + 1) * (long)p_Var12);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar19 + 1) * (long)p_Var12);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar14 = vunpcklps_avx(auVar23,auVar48);
  auVar81 = vunpckhps_avx(auVar23,auVar48);
  auVar89 = vunpcklps_avx(auVar37,auVar57);
  auVar13 = vunpckhps_avx(auVar37,auVar57);
  auVar23 = vunpcklps_avx(auVar14,auVar89);
  local_3e0 = vunpckhps_avx(auVar14,auVar89);
  local_240 = vunpcklps_avx(auVar81,auVar13);
  local_1c0 = vunpckhps_avx(auVar81,auVar13);
  auVar14 = vunpcklps_avx(auVar59,auVar64);
  auVar81 = vunpckhps_avx(auVar59,auVar64);
  auVar89 = vunpcklps_avx(auVar62,auVar72);
  auVar13 = vunpckhps_avx(auVar62,auVar72);
  local_200 = vunpcklps_avx(auVar14,auVar89);
  local_220 = vunpckhps_avx(auVar14,auVar89);
  auVar37 = vunpcklps_avx(auVar81,auVar13);
  local_1e0 = vunpckhps_avx(auVar81,auVar13);
  auVar35 = vpcmpeqd_avx(local_1e0._0_16_,local_1e0._0_16_);
  auVar36 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar35 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_1a0._16_16_ = auVar35;
  local_1a0._0_16_ = auVar36;
  local_310 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
  local_320 = local_310;
  fVar47 = pre->ray_space[k].vy.field_0.m128[0];
  fVar22 = pre->ray_space[k].vy.field_0.m128[1];
  fVar28 = pre->ray_space[k].vz.field_0.m128[0];
  fVar29 = pre->ray_space[k].vz.field_0.m128[1];
  fVar69 = *(float *)(ray + k * 4 + 0x20);
  auVar66._4_4_ = fVar69;
  auVar66._0_4_ = fVar69;
  auVar66._8_4_ = fVar69;
  auVar66._12_4_ = fVar69;
  auVar66._16_4_ = fVar69;
  auVar66._20_4_ = fVar69;
  auVar66._24_4_ = fVar69;
  auVar66._28_4_ = fVar69;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar81 = vsubps_avx(local_3e0,auVar66);
  auVar13 = vsubps_avx(local_240,auVar38);
  fVar44 = auVar13._0_4_;
  fVar45 = auVar13._4_4_;
  fVar46 = auVar13._8_4_;
  fVar41 = auVar13._12_4_;
  fVar43 = auVar13._16_4_;
  fVar52 = auVar13._20_4_;
  fVar75 = auVar13._24_4_;
  fVar55 = auVar81._0_4_;
  fVar56 = auVar81._4_4_;
  fVar34 = auVar81._8_4_;
  fVar42 = auVar81._12_4_;
  fVar51 = auVar81._16_4_;
  fVar53 = auVar81._20_4_;
  fVar76 = auVar81._24_4_;
  fVar30 = pre->ray_space[k].vy.field_0.m128[2];
  fVar31 = pre->ray_space[k].vz.field_0.m128[2];
  fVar32 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar65._4_4_ = uVar1;
  auVar65._0_4_ = uVar1;
  auVar65._8_4_ = uVar1;
  auVar65._12_4_ = uVar1;
  auVar65._16_4_ = uVar1;
  auVar65._20_4_ = uVar1;
  auVar65._24_4_ = uVar1;
  auVar65._28_4_ = uVar1;
  auVar14 = vsubps_avx(auVar23,auVar65);
  fVar77 = auVar14._0_4_;
  fVar78 = auVar14._4_4_;
  fVar79 = auVar14._8_4_;
  fVar80 = auVar14._12_4_;
  fVar83 = auVar14._16_4_;
  fVar84 = auVar14._20_4_;
  fVar85 = auVar14._24_4_;
  auVar49._0_4_ = fVar77 * fVar32 + fVar28 * fVar44 + fVar47 * fVar55;
  auVar49._4_4_ = fVar78 * fVar32 + fVar28 * fVar45 + fVar47 * fVar56;
  auVar49._8_4_ = fVar79 * fVar32 + fVar28 * fVar46 + fVar47 * fVar34;
  auVar49._12_4_ = fVar80 * fVar32 + fVar28 * fVar41 + fVar47 * fVar42;
  auVar49._16_4_ = fVar83 * fVar32 + fVar28 * fVar43 + fVar47 * fVar51;
  auVar49._20_4_ = fVar84 * fVar32 + fVar28 * fVar52 + fVar47 * fVar53;
  auVar49._24_4_ = fVar85 * fVar32 + fVar28 * fVar75 + fVar47 * fVar76;
  auVar49._28_4_ = in_register_0000151c + in_register_0000151c + local_3e0._28_4_;
  fVar33 = pre->ray_space[k].vx.field_0.m128[1];
  auVar88._0_4_ = fVar77 * fVar33 + fVar22 * fVar55 + fVar29 * fVar44;
  auVar88._4_4_ = fVar78 * fVar33 + fVar22 * fVar56 + fVar29 * fVar45;
  auVar88._8_4_ = fVar79 * fVar33 + fVar22 * fVar34 + fVar29 * fVar46;
  auVar88._12_4_ = fVar80 * fVar33 + fVar22 * fVar42 + fVar29 * fVar41;
  auVar88._16_4_ = fVar83 * fVar33 + fVar22 * fVar51 + fVar29 * fVar43;
  auVar88._20_4_ = fVar84 * fVar33 + fVar22 * fVar53 + fVar29 * fVar52;
  auVar88._24_4_ = fVar85 * fVar33 + fVar22 * fVar76 + fVar29 * fVar75;
  auVar88._28_4_ = in_register_0000151c + local_240._28_4_ + in_register_0000151c;
  fVar54 = pre->ray_space[k].vx.field_0.m128[2];
  auVar86._0_4_ = fVar54 * fVar77 + fVar55 * fVar30 + fVar44 * fVar31;
  auVar86._4_4_ = fVar54 * fVar78 + fVar56 * fVar30 + fVar45 * fVar31;
  auVar86._8_4_ = fVar54 * fVar79 + fVar34 * fVar30 + fVar46 * fVar31;
  auVar86._12_4_ = fVar54 * fVar80 + fVar42 * fVar30 + fVar41 * fVar31;
  auVar86._16_4_ = fVar54 * fVar83 + fVar51 * fVar30 + fVar43 * fVar31;
  auVar86._20_4_ = fVar54 * fVar84 + fVar53 * fVar30 + fVar52 * fVar31;
  auVar86._24_4_ = fVar54 * fVar85 + fVar76 * fVar30 + fVar75 * fVar31;
  auVar86._28_4_ = auVar14._28_4_ + auVar81._28_4_ + auVar13._28_4_;
  auVar81 = vsubps_avx(auVar37,auVar38);
  fVar44 = auVar81._0_4_;
  fVar56 = auVar81._4_4_;
  fVar41 = auVar81._8_4_;
  fVar51 = auVar81._12_4_;
  fVar75 = auVar81._16_4_;
  fVar78 = auVar81._20_4_;
  fVar83 = auVar81._24_4_;
  auVar13 = vsubps_avx(local_220,auVar66);
  fVar55 = auVar13._0_4_;
  fVar46 = auVar13._4_4_;
  fVar42 = auVar13._8_4_;
  fVar52 = auVar13._12_4_;
  fVar76 = auVar13._16_4_;
  fVar79 = auVar13._20_4_;
  fVar84 = auVar13._24_4_;
  fVar69 = auVar37._28_4_ + fVar69;
  auVar14 = vsubps_avx(local_200,auVar65);
  fVar45 = auVar14._0_4_;
  fVar34 = auVar14._4_4_;
  fVar43 = auVar14._8_4_;
  fVar53 = auVar14._12_4_;
  fVar77 = auVar14._16_4_;
  fVar80 = auVar14._20_4_;
  fVar85 = auVar14._24_4_;
  auVar60._0_4_ = fVar32 * fVar45 + fVar28 * fVar44 + fVar47 * fVar55;
  auVar60._4_4_ = fVar32 * fVar34 + fVar28 * fVar56 + fVar47 * fVar46;
  auVar60._8_4_ = fVar32 * fVar43 + fVar28 * fVar41 + fVar47 * fVar42;
  auVar60._12_4_ = fVar32 * fVar53 + fVar28 * fVar51 + fVar47 * fVar52;
  auVar60._16_4_ = fVar32 * fVar77 + fVar28 * fVar75 + fVar47 * fVar76;
  auVar60._20_4_ = fVar32 * fVar80 + fVar28 * fVar78 + fVar47 * fVar79;
  auVar60._24_4_ = fVar32 * fVar85 + fVar28 * fVar83 + fVar47 * fVar84;
  auVar60._28_4_ = auVar13._28_4_ + fVar69;
  auVar63._0_4_ = fVar22 * fVar55 + fVar29 * fVar44 + fVar33 * fVar45;
  auVar63._4_4_ = fVar22 * fVar46 + fVar29 * fVar56 + fVar33 * fVar34;
  auVar63._8_4_ = fVar22 * fVar42 + fVar29 * fVar41 + fVar33 * fVar43;
  auVar63._12_4_ = fVar22 * fVar52 + fVar29 * fVar51 + fVar33 * fVar53;
  auVar63._16_4_ = fVar22 * fVar76 + fVar29 * fVar75 + fVar33 * fVar77;
  auVar63._20_4_ = fVar22 * fVar79 + fVar29 * fVar78 + fVar33 * fVar80;
  auVar63._24_4_ = fVar22 * fVar84 + fVar29 * fVar83 + fVar33 * fVar85;
  auVar63._28_4_ = fVar22 + fVar28 + fVar33;
  auVar24._0_4_ = fVar54 * fVar45 + fVar30 * fVar55 + fVar31 * fVar44;
  auVar24._4_4_ = fVar54 * fVar34 + fVar30 * fVar46 + fVar31 * fVar56;
  auVar24._8_4_ = fVar54 * fVar43 + fVar30 * fVar42 + fVar31 * fVar41;
  auVar24._12_4_ = fVar54 * fVar53 + fVar30 * fVar52 + fVar31 * fVar51;
  auVar24._16_4_ = fVar54 * fVar77 + fVar30 * fVar76 + fVar31 * fVar75;
  auVar24._20_4_ = fVar54 * fVar80 + fVar30 * fVar79 + fVar31 * fVar78;
  auVar24._24_4_ = fVar54 * fVar85 + fVar30 * fVar84 + fVar31 * fVar83;
  auVar24._28_4_ = fVar33 + fVar30 + auVar81._28_4_;
  auVar13 = vsubps_avx(auVar60,auVar49);
  auVar81 = vsubps_avx(auVar63,auVar88);
  fVar47 = auVar81._0_4_;
  fVar28 = auVar81._4_4_;
  fVar30 = auVar81._8_4_;
  fVar32 = auVar81._12_4_;
  fVar54 = auVar81._16_4_;
  fVar55 = auVar81._20_4_;
  fVar56 = auVar81._24_4_;
  fVar22 = auVar13._0_4_;
  fVar29 = auVar13._4_4_;
  fVar31 = auVar13._8_4_;
  fVar33 = auVar13._12_4_;
  fVar44 = auVar13._16_4_;
  fVar45 = auVar13._20_4_;
  fVar46 = auVar13._24_4_;
  auVar61._0_4_ = fVar22 * fVar22 + fVar47 * fVar47;
  auVar61._4_4_ = fVar29 * fVar29 + fVar28 * fVar28;
  auVar61._8_4_ = fVar31 * fVar31 + fVar30 * fVar30;
  auVar61._12_4_ = fVar33 * fVar33 + fVar32 * fVar32;
  auVar61._16_4_ = fVar44 * fVar44 + fVar54 * fVar54;
  auVar61._20_4_ = fVar45 * fVar45 + fVar55 * fVar55;
  auVar61._24_4_ = fVar46 * fVar46 + fVar56 * fVar56;
  auVar61._28_4_ = auVar63._28_4_ + auVar60._28_4_;
  auVar14._4_4_ = fVar28 * -auVar88._4_4_;
  auVar14._0_4_ = fVar47 * -auVar88._0_4_;
  auVar14._8_4_ = fVar30 * -auVar88._8_4_;
  auVar14._12_4_ = fVar32 * -auVar88._12_4_;
  auVar14._16_4_ = fVar54 * -auVar88._16_4_;
  auVar14._20_4_ = fVar55 * -auVar88._20_4_;
  auVar14._24_4_ = fVar56 * -auVar88._24_4_;
  auVar14._28_4_ = -auVar88._28_4_;
  auVar81 = vrcpps_avx(auVar61);
  auVar89._4_4_ = auVar49._4_4_ * fVar29;
  auVar89._0_4_ = auVar49._0_4_ * fVar22;
  auVar89._8_4_ = auVar49._8_4_ * fVar31;
  auVar89._12_4_ = auVar49._12_4_ * fVar33;
  auVar89._16_4_ = auVar49._16_4_ * fVar44;
  auVar89._20_4_ = auVar49._20_4_ * fVar45;
  auVar89._24_4_ = auVar49._24_4_ * fVar46;
  auVar89._28_4_ = fVar69;
  auVar14 = vsubps_avx(auVar14,auVar89);
  auVar67._8_4_ = 0x3f800000;
  auVar67._0_8_ = 0x3f8000003f800000;
  auVar67._12_4_ = 0x3f800000;
  auVar67._16_4_ = 0x3f800000;
  auVar67._20_4_ = 0x3f800000;
  auVar67._24_4_ = 0x3f800000;
  auVar67._28_4_ = 0x3f800000;
  fVar69 = auVar81._0_4_;
  fVar34 = auVar81._4_4_;
  auVar15._4_4_ = fVar34 * auVar61._4_4_;
  auVar15._0_4_ = fVar69 * auVar61._0_4_;
  fVar41 = auVar81._8_4_;
  auVar15._8_4_ = fVar41 * auVar61._8_4_;
  fVar42 = auVar81._12_4_;
  auVar15._12_4_ = fVar42 * auVar61._12_4_;
  fVar43 = auVar81._16_4_;
  auVar15._16_4_ = fVar43 * auVar61._16_4_;
  fVar51 = auVar81._20_4_;
  auVar15._20_4_ = fVar51 * auVar61._20_4_;
  fVar52 = auVar81._24_4_;
  auVar15._24_4_ = fVar52 * auVar61._24_4_;
  auVar15._28_4_ = auVar61._28_4_;
  auVar89 = vsubps_avx(auVar67,auVar15);
  auVar16._4_4_ = auVar14._4_4_ * (fVar34 + fVar34 * auVar89._4_4_);
  auVar16._0_4_ = auVar14._0_4_ * (fVar69 + fVar69 * auVar89._0_4_);
  auVar16._8_4_ = auVar14._8_4_ * (fVar41 + fVar41 * auVar89._8_4_);
  auVar16._12_4_ = auVar14._12_4_ * (fVar42 + fVar42 * auVar89._12_4_);
  auVar16._16_4_ = auVar14._16_4_ * (fVar43 + fVar43 * auVar89._16_4_);
  auVar16._20_4_ = auVar14._20_4_ * (fVar51 + fVar51 * auVar89._20_4_);
  auVar16._24_4_ = auVar14._24_4_ * (fVar52 + fVar52 * auVar89._24_4_);
  auVar16._28_4_ = auVar81._28_4_ + auVar89._28_4_;
  auVar81 = vminps_avx(auVar16,auVar67);
  auVar89 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_300 = vmaxps_avx(auVar81,auVar89);
  fVar69 = local_300._0_4_;
  fVar75 = local_300._4_4_;
  fVar76 = local_300._8_4_;
  fVar77 = local_300._12_4_;
  fVar78 = local_300._16_4_;
  fVar79 = local_300._20_4_;
  fVar80 = local_300._24_4_;
  fVar34 = auVar49._0_4_ + fVar69 * fVar22;
  fVar41 = auVar49._4_4_ + fVar75 * fVar29;
  fVar42 = auVar49._8_4_ + fVar76 * fVar31;
  fVar43 = auVar49._12_4_ + fVar77 * fVar33;
  fVar44 = auVar49._16_4_ + fVar78 * fVar44;
  fVar45 = auVar49._20_4_ + fVar79 * fVar45;
  fVar46 = auVar49._24_4_ + fVar80 * fVar46;
  fVar47 = auVar88._0_4_ + fVar69 * fVar47;
  fVar51 = auVar88._4_4_ + fVar75 * fVar28;
  fVar52 = auVar88._8_4_ + fVar76 * fVar30;
  fVar53 = auVar88._12_4_ + fVar77 * fVar32;
  fVar54 = auVar88._16_4_ + fVar78 * fVar54;
  fVar55 = auVar88._20_4_ + fVar79 * fVar55;
  fVar56 = auVar88._24_4_ + fVar80 * fVar56;
  auVar81 = vsubps_avx(auVar24,auVar86);
  auVar14 = vsubps_avx(local_1e0,local_1c0);
  local_2c0._0_4_ = auVar86._0_4_ + fVar69 * auVar81._0_4_;
  local_2c0._4_4_ = auVar86._4_4_ + fVar75 * auVar81._4_4_;
  local_2c0._8_4_ = auVar86._8_4_ + fVar76 * auVar81._8_4_;
  local_2c0._12_4_ = auVar86._12_4_ + fVar77 * auVar81._12_4_;
  local_2c0._16_4_ = auVar86._16_4_ + fVar78 * auVar81._16_4_;
  local_2c0._20_4_ = auVar86._20_4_ + fVar79 * auVar81._20_4_;
  local_2c0._24_4_ = auVar86._24_4_ + fVar80 * auVar81._24_4_;
  local_2c0._28_4_ = auVar86._28_4_ + auVar81._28_4_;
  auVar68 = ZEXT3264(local_2c0);
  fVar22 = local_1c0._0_4_ + fVar69 * auVar14._0_4_;
  fVar28 = local_1c0._4_4_ + fVar75 * auVar14._4_4_;
  fVar29 = local_1c0._8_4_ + fVar76 * auVar14._8_4_;
  fVar69 = local_1c0._12_4_ + fVar77 * auVar14._12_4_;
  fVar30 = local_1c0._16_4_ + fVar78 * auVar14._16_4_;
  fVar31 = local_1c0._20_4_ + fVar79 * auVar14._20_4_;
  fVar32 = local_1c0._24_4_ + fVar80 * auVar14._24_4_;
  fVar33 = local_1c0._28_4_ + auVar81._28_4_;
  auVar39._0_4_ = fVar34 * fVar34 + fVar47 * fVar47;
  auVar39._4_4_ = fVar41 * fVar41 + fVar51 * fVar51;
  auVar39._8_4_ = fVar42 * fVar42 + fVar52 * fVar52;
  auVar39._12_4_ = fVar43 * fVar43 + fVar53 * fVar53;
  auVar39._16_4_ = fVar44 * fVar44 + fVar54 * fVar54;
  auVar39._20_4_ = fVar45 * fVar45 + fVar55 * fVar55;
  auVar39._24_4_ = fVar46 * fVar46 + fVar56 * fVar56;
  auVar39._28_4_ = auVar49._28_4_ + auVar13._28_4_ + auVar88._28_4_ + auVar49._28_4_;
  auVar81._4_4_ = fVar28 * fVar28;
  auVar81._0_4_ = fVar22 * fVar22;
  auVar81._8_4_ = fVar29 * fVar29;
  auVar81._12_4_ = fVar69 * fVar69;
  auVar81._16_4_ = fVar30 * fVar30;
  auVar81._20_4_ = fVar31 * fVar31;
  auVar81._24_4_ = fVar32 * fVar32;
  auVar81._28_4_ = auVar88._28_4_ + auVar49._28_4_;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  auVar58._16_4_ = uVar1;
  auVar58._20_4_ = uVar1;
  auVar58._24_4_ = uVar1;
  auVar58._28_4_ = uVar1;
  auVar13 = vcmpps_avx(auVar39,auVar81,2);
  auVar81 = vcmpps_avx(auVar58,local_2c0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar70._16_4_ = uVar1;
  auVar70._20_4_ = uVar1;
  auVar70._24_4_ = uVar1;
  auVar70._28_4_ = uVar1;
  auVar71 = ZEXT3264(auVar70);
  auVar14 = vcmpps_avx(local_2c0,auVar70,2);
  auVar81 = vandps_avx(auVar14,auVar81);
  fVar47 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar81 = vandps_avx(auVar81,auVar13);
  auVar13._4_4_ = fVar47 * (fVar28 + fVar28);
  auVar13._0_4_ = fVar47 * (fVar22 + fVar22);
  auVar13._8_4_ = fVar47 * (fVar29 + fVar29);
  auVar13._12_4_ = fVar47 * (fVar69 + fVar69);
  auVar13._16_4_ = fVar47 * (fVar30 + fVar30);
  auVar13._20_4_ = fVar47 * (fVar31 + fVar31);
  auVar13._24_4_ = fVar47 * (fVar32 + fVar32);
  auVar13._28_4_ = fVar33 + fVar33;
  auVar13 = vcmpps_avx(local_2c0,auVar13,6);
  auVar81 = vandps_avx(auVar13,auVar81);
  auVar35 = vpslld_avx(auVar81._0_16_,0x1f);
  auVar36 = vpsrad_avx(auVar35,0x1f);
  auVar35 = vpslld_avx(auVar81._16_16_,0x1f);
  auVar35 = vpsrad_avx(auVar35,0x1f);
  auVar25._16_16_ = auVar35;
  auVar25._0_16_ = auVar36;
  auVar81 = auVar25 & ~local_1a0;
  if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar81 >> 0x7f,0) != '\0') ||
        (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar81 >> 0xbf,0) != '\0') ||
      (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar81[0x1f] < '\0') {
    auVar81 = vandnps_avx(local_1a0,auVar25);
    local_2a0 = vsubps_avx(local_200,auVar23);
    local_280 = vsubps_avx(local_220,local_3e0);
    local_260 = vsubps_avx(auVar37,local_240);
    auVar13 = vcmpps_avx(auVar89,local_2a0,4);
    auVar89 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar14 = vcmpps_avx(auVar89,local_280,4);
    auVar14 = vorps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar89,local_260,4);
    auVar13 = vorps_avx(auVar14,auVar13);
    auVar14 = auVar81 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      local_340 = vandps_avx(auVar13,auVar81);
      local_2e0 = ZEXT832(0) << 0x20;
      auVar73._8_4_ = 0x7f800000;
      auVar73._0_8_ = 0x7f8000007f800000;
      auVar73._12_4_ = 0x7f800000;
      auVar73._16_4_ = 0x7f800000;
      auVar73._20_4_ = 0x7f800000;
      auVar73._24_4_ = 0x7f800000;
      auVar73._28_4_ = 0x7f800000;
      auVar74 = ZEXT3264(auVar73);
      auVar81 = vblendvps_avx(auVar73,local_2c0,local_340);
      auVar13 = vshufps_avx(auVar81,auVar81,0xb1);
      auVar13 = vminps_avx(auVar81,auVar13);
      auVar14 = vshufpd_avx(auVar13,auVar13,5);
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar14 = vperm2f128_avx(auVar13,auVar13,1);
      auVar13 = vminps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar81,auVar13,0);
      auVar14 = local_340 & auVar13;
      auVar81 = local_340;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar13,local_340);
      }
      uVar17 = vmovmskps_avx(auVar81);
      uVar19 = 1 << ((byte)k & 0x1f);
      uVar18 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      pauVar20 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar19 >> 4) * 0x10);
      auVar81 = vcmpps_avx(local_200,local_200,0xf);
      auVar82 = ZEXT3264(auVar81);
      auVar87 = ZEXT464(0) << 0x20;
      do {
        local_370.hit = local_180;
        local_370.valid = (int *)local_400;
        uVar21 = (ulong)uVar18;
        uVar18 = *(uint *)(local_320 + uVar21 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar18].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_340 + uVar21 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar1 = *(undefined4 *)(local_300 + uVar21 * 4);
            uVar2 = *(undefined4 *)(local_2e0 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2a0 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_280 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_260 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar1;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
            *(uint *)(ray + k * 4 + 0x220) = (line->primIDs).field_0.i[uVar21];
            *(uint *)(ray + k * 4 + 0x240) = uVar18;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          local_120 = *(undefined4 *)(local_300 + uVar21 * 4);
          local_100 = *(undefined4 *)(local_2e0 + uVar21 * 4);
          auStack_b0 = vpshufd_avx(ZEXT416(uVar18),0);
          local_e0 = (line->primIDs).field_0.i[uVar21];
          uVar1 = *(undefined4 *)(local_2a0 + uVar21 * 4);
          uVar2 = *(undefined4 *)(local_280 + uVar21 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_260 + uVar21 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180[0] = (RTCHitN)(char)uVar1;
          local_180[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar1;
          local_180[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar1;
          local_180[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar1;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar1;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar1;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar1;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar1;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar21 * 4);
          local_400 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar19 & 0xf) << 4));
          local_3f0 = *pauVar20;
          local_370.geometryUserPtr = pGVar10->userPtr;
          local_370.context = context->user;
          local_370.N = 8;
          local_370.ray = (RTCRayN *)ray;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_3a0 = auVar68._0_32_;
            local_3c0 = auVar71._0_32_;
            local_3e0._0_8_ = pauVar20;
            auVar81 = ZEXT1632(auVar82._0_16_);
            (*pGVar10->intersectionFilterN)(&local_370);
            auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar81 = vcmpps_avx(auVar81,auVar81,0xf);
            auVar82 = ZEXT3264(auVar81);
            auVar74 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar71 = ZEXT3264(local_3c0);
            auVar68 = ZEXT3264(local_3a0);
            pauVar20 = (undefined1 (*) [16])local_3e0._0_8_;
          }
          auVar35 = vpcmpeqd_avx(auVar87._0_16_,local_400);
          auVar36 = vpcmpeqd_avx(auVar87._0_16_,local_3f0);
          auVar50._16_16_ = auVar36;
          auVar50._0_16_ = auVar35;
          auVar81 = auVar82._0_32_ & ~auVar50;
          if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar81 >> 0x7f,0) == '\0') &&
                (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar81 >> 0xbf,0) == '\0') &&
              (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar81[0x1f]) {
            auVar26._0_4_ = auVar82._0_4_ ^ auVar35._0_4_;
            auVar26._4_4_ = auVar82._4_4_ ^ auVar35._4_4_;
            auVar26._8_4_ = auVar82._8_4_ ^ auVar35._8_4_;
            auVar26._12_4_ = auVar82._12_4_ ^ auVar35._12_4_;
            auVar26._16_4_ = auVar82._16_4_ ^ auVar36._0_4_;
            auVar26._20_4_ = auVar82._20_4_ ^ auVar36._4_4_;
            auVar26._24_4_ = auVar82._24_4_ ^ auVar36._8_4_;
            auVar26._28_4_ = auVar82._28_4_ ^ auVar36._12_4_;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              local_3a0 = auVar68._0_32_;
              local_3c0 = auVar71._0_32_;
              local_3e0._0_8_ = pauVar20;
              auVar81 = ZEXT1632(auVar82._0_16_);
              (*p_Var12)(&local_370);
              auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar81 = vcmpps_avx(auVar81,auVar81,0xf);
              auVar82 = ZEXT3264(auVar81);
              auVar74 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar71 = ZEXT3264(local_3c0);
              auVar68 = ZEXT3264(local_3a0);
              pauVar20 = (undefined1 (*) [16])local_3e0._0_8_;
            }
            auVar35 = vpcmpeqd_avx(auVar87._0_16_,local_400);
            auVar36 = vpcmpeqd_avx(auVar87._0_16_,local_3f0);
            auVar40._16_16_ = auVar36;
            auVar40._0_16_ = auVar35;
            auVar26._0_4_ = auVar82._0_4_ ^ auVar35._0_4_;
            auVar26._4_4_ = auVar82._4_4_ ^ auVar35._4_4_;
            auVar26._8_4_ = auVar82._8_4_ ^ auVar35._8_4_;
            auVar26._12_4_ = auVar82._12_4_ ^ auVar35._12_4_;
            auVar26._16_4_ = auVar82._16_4_ ^ auVar36._0_4_;
            auVar26._20_4_ = auVar82._20_4_ ^ auVar36._4_4_;
            auVar26._24_4_ = auVar82._24_4_ ^ auVar36._8_4_;
            auVar26._28_4_ = auVar82._28_4_ ^ auVar36._12_4_;
            auVar81 = auVar82._0_32_ & ~auVar40;
            if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar81 >> 0x7f,0) != '\0') ||
                  (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar81 >> 0xbf,0) != '\0') ||
                (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar81[0x1f] < '\0') {
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])local_370.hit);
              *(undefined1 (*) [32])(local_370.ray + 0x180) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0x20));
              *(undefined1 (*) [32])(local_370.ray + 0x1a0) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0x40));
              *(undefined1 (*) [32])(local_370.ray + 0x1c0) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0x60));
              *(undefined1 (*) [32])(local_370.ray + 0x1e0) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0x80));
              *(undefined1 (*) [32])(local_370.ray + 0x200) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0xa0));
              *(undefined1 (*) [32])(local_370.ray + 0x220) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0xc0));
              *(undefined1 (*) [32])(local_370.ray + 0x240) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0xe0));
              *(undefined1 (*) [32])(local_370.ray + 0x260) = auVar81;
              auVar81 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(local_370.hit + 0x100));
              *(undefined1 (*) [32])(local_370.ray + 0x280) = auVar81;
            }
          }
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            *(int *)(ray + k * 4 + 0x100) = auVar71._0_4_;
          }
          else {
            auVar71 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          *(undefined4 *)(local_340 + uVar21 * 4) = 0;
          auVar35 = vshufps_avx(auVar71._0_16_,auVar71._0_16_,0);
          auVar27._16_16_ = auVar35;
          auVar27._0_16_ = auVar35;
          auVar81 = vcmpps_avx(auVar68._0_32_,auVar27,2);
          local_340 = vandps_avx(auVar81,local_340);
        }
        if ((((((((local_340 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_340 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_340 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_340 >> 0x7f,0) == '\0') &&
              (local_340 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_340 >> 0xbf,0) == '\0') &&
            (local_340 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_340[0x1f]) {
          return;
        }
        auVar81 = vblendvps_avx(auVar74._0_32_,auVar68._0_32_,local_340);
        auVar13 = vshufps_avx(auVar81,auVar81,0xb1);
        auVar13 = vminps_avx(auVar81,auVar13);
        auVar14 = vshufpd_avx(auVar13,auVar13,5);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar14 = vperm2f128_avx(auVar13,auVar13,1);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar13 = vcmpps_avx(auVar81,auVar13,0);
        auVar14 = local_340 & auVar13;
        auVar81 = local_340;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar81 = vandps_avx(auVar13,local_340);
        }
        uVar17 = vmovmskps_avx(auVar81);
        uVar18 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }